

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,try_statement *s)

{
  statement *psVar1;
  long *plVar2;
  completion *pcVar3;
  object_ptr o;
  completion fc;
  auto_scope catch_scope;
  completion c;
  
  eval(&c,this,(s->block_)._M_t.
               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
               super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
  if ((c.type == throw_) &&
     (psVar1 = (s->catch_)._M_t.
               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
               super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,
     psVar1 != (statement *)0x0)) {
    gc_heap_ptr_untyped::get(&(this->global_).super_gc_heap_ptr_untyped);
    global_object::make_object((global_object *)&o);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
    catch_scope.old_scopes.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)(s->catch_id_)._M_dataplus._M_p;
    catch_scope.parent = (impl *)(s->catch_id_)._M_string_length;
    string::string((string *)&fc,this->heap_,(wstring_view *)&catch_scope);
    (**(code **)(*plVar2 + 8))(plVar2,&fc,&c.result,4);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&fc);
    auto_scope::auto_scope(&catch_scope,this,&o,&this->active_scope_);
    eval(&fc,this,psVar1);
    completion::operator=(&c,&fc);
    value::~value(&fc.result);
    auto_scope::~auto_scope(&catch_scope);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
  }
  psVar1 = (s->finally_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar1 == (statement *)0x0) {
    completion::completion(__return_storage_ptr__,&c);
  }
  else {
    eval(&fc,this,psVar1);
    pcVar3 = &fc;
    if (fc.type == normal) {
      pcVar3 = &c;
    }
    completion::completion(__return_storage_ptr__,pcVar3);
    value::~value(&fc.result);
  }
  value::~value(&c.result);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const try_statement& s) {
        auto c = eval(s.block());
        if (c.type != completion_type::throw_) {
            // Nothing to do
        } else if (auto catch_ = s.catch_block()) {
            auto o = global_->make_object();
            o->put(string{heap_, s.catch_id()}, c.result, property_attribute::dont_delete);
            auto_scope catch_scope{*this, o, active_scope_};
            c = eval(*catch_);
        }
        if (auto finally_ = s.finally_block()) {
            auto fc = eval(*finally_);
            return fc ? fc : c;
        }
        return c;
    }